

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execShiftEa<(moira::Instr)70,(moira::Mode)3,(moira::Size)2>(Moira *this,u16 op)

{
  bool bVar1;
  u32 uVar2;
  u32 data;
  u32 ea;
  uint local_10;
  u32 local_c;
  
  bVar1 = readOp<(moira::Mode)3,(moira::Size)2,0ul>(this,op & 7,&local_c,&local_10);
  if (bVar1) {
    uVar2 = (this->reg).pc;
    (this->reg).pc0 = uVar2;
    (this->queue).ird = (this->queue).irc;
    uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar2 + 2);
    (this->queue).irc = (u16)uVar2;
    bVar1 = (bool)((byte)local_10 & 1);
    (this->reg).sr.x = bVar1;
    (this->reg).sr.c = bVar1;
    (this->reg).sr.v = false;
    (this->reg).sr.n = (bool)((byte)(local_10 >> 0x10) & 1);
    (this->reg).sr.z = (local_10 & 0x1fffe) == 0;
    writeM<(moira::MemSpace)1,(moira::Size)2,4ul>(this,local_c,local_10 >> 1 & 0xffff);
  }
  return;
}

Assistant:

void
Moira::execShiftEa(u16 op)
{
    int src = _____________xxx(op);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;

    prefetch();

    writeM<M,S, POLLIPL>(ea, shift<I,S>(1, data));
}